

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O0

QVariant * __thiscall QSystemLocale::query(QSystemLocale *this,QueryType type,QVariant *in)

{
  QLatin1StringView other;
  QLatin1StringView other_00;
  QStringView name;
  QStringView str;
  QStringView str_00;
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  int in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QString *e;
  add_const_t<QList<QString>_> *__range2;
  QLocale *lc_messages;
  QLocale *lc_monetary;
  QLocale *lc_time;
  QLocale *lc_numeric;
  QSystemLocaleData *d;
  QString joined;
  QStringView territory;
  QStringView script;
  QStringView language;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList lst;
  QString languages;
  QString meas_locale;
  QReadLocker locker;
  undefined4 in_stack_fffffffffffff6e8;
  SplitBehaviorFlags in_stack_fffffffffffff6ec;
  undefined4 in_stack_fffffffffffff6f0;
  uint in_stack_fffffffffffff6f4;
  QString *in_stack_fffffffffffff6f8;
  QStringView *in_stack_fffffffffffff700;
  QStringView *in_stack_fffffffffffff708;
  QStringView *in_stack_fffffffffffff710;
  QStringBuilder<char16_t,_QStringView_&> *in_stack_fffffffffffff718;
  QString *in_stack_fffffffffffff720;
  QLocale *in_stack_fffffffffffff728;
  QSystemLocaleData *in_stack_fffffffffffff730;
  FormatType format;
  undefined4 in_stack_fffffffffffff738;
  undefined2 in_stack_fffffffffffff73c;
  undefined2 in_stack_fffffffffffff73e;
  QLocale *in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff748;
  undefined2 in_stack_fffffffffffff74c;
  undefined2 in_stack_fffffffffffff74e;
  QLocale *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  QString *in_stack_fffffffffffff760;
  double in_stack_fffffffffffff768;
  QLocale *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  QTime time;
  qsizetype in_stack_fffffffffffff780;
  QDate in_stack_fffffffffffff788;
  QLocale *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  storage_type_conflict *in_stack_fffffffffffff7f8;
  QStringView local_558;
  QStringView local_548;
  QStringView local_538;
  QString *local_528;
  const_iterator local_520;
  const_iterator local_518;
  QChar local_50a [25];
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4a8;
  undefined1 *puStack_4a0;
  undefined1 *local_498;
  undefined1 *local_468;
  undefined1 *puStack_460;
  undefined1 *local_458;
  GroupSizes local_48;
  GroupSizes local_34;
  undefined1 *local_10;
  long local_8;
  
  time.mds = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>_>
                       *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
  if (pTVar3 == (Type *)0x0) {
    ::QVariant::QVariant((QVariant *)0x7280aa);
  }
  else if (in_EDX == 0x27) {
    QSystemLocaleData::readEnvironment(in_stack_fffffffffffff730);
    ::QVariant::QVariant((QVariant *)0x7280d3);
  }
  else {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QReadLocker::QReadLocker
              ((QReadLocker *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
               (QReadWriteLock *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
    format = (FormatType)((ulong)in_stack_fffffffffffff730 >> 0x20);
    switch(in_EDX) {
    case 2:
      QLocale::decimalPoint((QLocale *)in_stack_fffffffffffff6f8);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x7281ee);
      break;
    case 3:
      QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x728228)
      ;
      local_48 = QLocaleData::groupSizes
                           ((QLocaleData *)
                            CONCAT26(in_stack_fffffffffffff73e,
                                     CONCAT24(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)))
      ;
      local_34 = local_48;
      ::QVariant::fromValue<QLocaleData::GroupSizes,_true>((GroupSizes *)in_stack_fffffffffffff708);
      break;
    case 4:
      QLocale::groupSeparator((QLocale *)in_stack_fffffffffffff6f8);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x7282db);
      break;
    case 5:
      QLocale::zeroDigit((QLocale *)in_stack_fffffffffffff6f8);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728324);
      break;
    case 6:
      QLocale::negativeSign((QLocale *)in_stack_fffffffffffff6f8);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72836d);
      break;
    case 7:
      QLocale::dateFormat((QLocale *)
                          CONCAT26(in_stack_fffffffffffff73e,
                                   CONCAT24(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)),
                          format);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x7283b8);
      break;
    case 8:
      QLocale::dateFormat((QLocale *)
                          CONCAT26(in_stack_fffffffffffff73e,
                                   CONCAT24(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)),
                          format);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728406);
      break;
    case 9:
      QLocale::timeFormat((QLocale *)
                          CONCAT26(in_stack_fffffffffffff73e,
                                   CONCAT24(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)),
                          format);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728451);
      break;
    case 10:
      QLocale::timeFormat((QLocale *)
                          CONCAT26(in_stack_fffffffffffff73e,
                                   CONCAT24(in_stack_fffffffffffff73c,in_stack_fffffffffffff738)),
                          format);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72849f);
      break;
    case 0xb:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::dayName((QLocale *)in_stack_fffffffffffff708,
                       (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                       (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72851b);
      break;
    case 0xc:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::dayName((QLocale *)in_stack_fffffffffffff708,
                       (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                       (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72859a);
      break;
    case 0xd:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::dayName((QLocale *)in_stack_fffffffffffff708,
                       (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                       (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728619);
      break;
    case 0xe:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::monthName((QLocale *)in_stack_fffffffffffff708,
                         (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                         (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72880f);
      break;
    case 0xf:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::monthName((QLocale *)in_stack_fffffffffffff708,
                         (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                         (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72888e);
      break;
    case 0x10:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::monthName((QLocale *)in_stack_fffffffffffff708,
                         (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                         (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72890d);
      break;
    case 0x11:
      ::QVariant::toDate((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::toString((QLocale *)
                        CONCAT26(in_stack_fffffffffffff74e,
                                 CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)),
                        in_stack_fffffffffffff788,
                        (FormatType)((ulong)in_stack_fffffffffffff740 >> 0x20));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728b11);
      break;
    case 0x12:
      ::QVariant::toDate((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::toString((QLocale *)
                        CONCAT26(in_stack_fffffffffffff74e,
                                 CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)),
                        in_stack_fffffffffffff788,
                        (FormatType)((ulong)in_stack_fffffffffffff740 >> 0x20));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728b9e);
      break;
    case 0x13:
      ::QVariant::toTime((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::toString((QLocale *)
                        CONCAT26(in_stack_fffffffffffff74e,
                                 CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)),time
                        ,(FormatType)((ulong)in_stack_fffffffffffff740 >> 0x20));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728c24);
      break;
    case 0x14:
      ::QVariant::toTime((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::toString((QLocale *)
                        CONCAT26(in_stack_fffffffffffff74e,
                                 CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)),time
                        ,(FormatType)((ulong)in_stack_fffffffffffff740 >> 0x20));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728cad);
      break;
    case 0x15:
      QLocale::dateTimeFormat
                (in_stack_fffffffffffff740,
                 CONCAT22(in_stack_fffffffffffff73e,in_stack_fffffffffffff73c));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728cf8);
      break;
    case 0x16:
      QLocale::dateTimeFormat
                (in_stack_fffffffffffff740,
                 CONCAT22(in_stack_fffffffffffff73e,in_stack_fffffffffffff73c));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728d46);
      break;
    case 0x17:
      ::QVariant::toDateTime
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::toString(in_stack_fffffffffffff750,
                        (QDateTime *)
                        CONCAT26(in_stack_fffffffffffff74e,
                                 CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)),
                        (FormatType)((ulong)in_stack_fffffffffffff740 >> 0x20));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728dc0);
      QDateTime::~QDateTime((QDateTime *)0x728dcd);
      break;
    case 0x18:
      ::QVariant::toDateTime
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::toString(in_stack_fffffffffffff750,
                        (QDateTime *)
                        CONCAT26(in_stack_fffffffffffff74e,
                                 CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)),
                        (FormatType)((ulong)in_stack_fffffffffffff740 >> 0x20));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728e74);
      QDateTime::~QDateTime((QDateTime *)0x728e81);
      break;
    case 0x19:
      local_468 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_460 = &DAT_aaaaaaaaaaaaaaaa;
      local_458 = &DAT_aaaaaaaaaaaaaaaa;
      QString::fromLatin1<void>
                ((QByteArray *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff6f8,
                 CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
      other.m_data = (char *)in_stack_fffffffffffff718;
      other.m_size = (qsizetype)in_stack_fffffffffffff710;
      iVar2 = QString::compare((QString *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),other,
                               CaseInsensitive);
      if (iVar2 == 0) {
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20));
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff6f8,
                   CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
        other_00.m_data = (char *)in_stack_fffffffffffff718;
        other_00.m_size = (qsizetype)in_stack_fffffffffffff710;
        iVar2 = QString::compare((QString *)
                                 CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                                 other_00,CaseInsensitive);
        if (iVar2 == 0) {
          ::QVariant::QVariant
                    ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                     (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20));
        }
        else {
          QLocale::QLocale((QLocale *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
          iVar2 = (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
          QLocale::measurementSystem((QLocale *)in_stack_fffffffffffff720);
          ::QVariant::QVariant
                    ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),iVar2
                    );
          QLocale::~QLocale((QLocale *)0x729630);
        }
      }
      QString::~QString((QString *)0x72968b);
      break;
    case 0x1a:
      QLocale::positiveSign((QLocale *)in_stack_fffffffffffff6f8);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728ef4);
      break;
    case 0x1b:
      QLocale::amText(in_stack_fffffffffffff728);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728f3d);
      break;
    case 0x1c:
      QLocale::pmText(in_stack_fffffffffffff728);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728f86);
      break;
    case 0x1d:
      QLocale::firstDayOfWeek((QLocale *)in_stack_fffffffffffff720);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20));
      break;
    case 0x1f:
      ::QVariant::toUInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                         (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::currencySymbol
                (in_stack_fffffffffffff740,
                 CONCAT22(in_stack_fffffffffffff73e,in_stack_fffffffffffff73c));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x72903a);
      break;
    case 0x20:
      iVar2 = ::QVariant::userType((QVariant *)0x729057);
      switch(iVar2) {
      case 2:
        ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                          (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::QString((QString *)0x7290d5);
        QLocale::toCurrencyString
                  ((QLocale *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4,
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::~QString((QString *)0x72911d);
        QString::~QString((QString *)0x72912a);
        break;
      case 3:
        ::QVariant::toUInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0)
                           ,(bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::QString((QString *)0x7291a3);
        QLocale::toCurrencyString
                  ((QLocale *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4,
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::~QString((QString *)0x7291eb);
        QString::~QString((QString *)0x7291f8);
        break;
      case 4:
        ::QVariant::toLongLong
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::QString((QString *)0x729349);
        QLocale::toCurrencyString
                  (in_stack_fffffffffffff770,(qlonglong)in_stack_fffffffffffff768,
                   in_stack_fffffffffffff760);
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::~QString((QString *)0x729392);
        QString::~QString((QString *)0x72939f);
        break;
      case 5:
        ::QVariant::toULongLong
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::QString((QString *)0x729416);
        QLocale::toCurrencyString
                  ((QLocale *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                   (qulonglong)in_stack_fffffffffffff750,
                   (QString *)
                   CONCAT26(in_stack_fffffffffffff74e,
                            CONCAT24(in_stack_fffffffffffff74c,in_stack_fffffffffffff748)));
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::~QString((QString *)0x72945c);
        QString::~QString((QString *)0x729469);
        break;
      case 6:
        ::QVariant::toDouble
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::QString((QString *)0x729273);
        QLocale::toCurrencyString
                  (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                   in_stack_fffffffffffff75c);
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::~QString((QString *)0x7292c2);
        QString::~QString((QString *)0x7292cf);
        break;
      default:
        QString::QString((QString *)0x7294b2);
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        QString::~QString((QString *)0x7294d4);
      }
      break;
    case 0x21:
      QString::fromLatin1<void>
                ((QByteArray *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x7296df);
      break;
    case 0x22:
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x729700);
      if (bVar1) {
        local_4a8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_4a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_498 = &DAT_aaaaaaaaaaaaaaaa;
        qgetenv((char *)in_stack_fffffffffffff708);
        QString::fromLatin1<void>
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
        QByteArray::~QByteArray((QByteArray *)0x729788);
        local_4d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_4d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_4c8 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::QList((QList<QString> *)0x7297c2);
        bVar1 = QString::isEmpty((QString *)0x7297cf);
        if (bVar1) {
          QString::fromLatin1<void>
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
          QList<QString>::append
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0)
                     ,(rvalue_ref)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
          QString::~QString((QString *)0x729817);
        }
        else {
          QChar::QChar<char16_t,_true>(local_50a,L':');
          QFlags<Qt::SplitBehaviorFlags>::QFlags
                    ((QFlags<Qt::SplitBehaviorFlags> *)
                     CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                     in_stack_fffffffffffff6ec);
          QString::split((QString *)in_stack_fffffffffffff700,
                         (QChar)(char16_t)((ulong)in_stack_fffffffffffff728 >> 0x30),
                         (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                         SUB84(in_stack_fffffffffffff728,0),
                         (CaseSensitivity)((ulong)in_stack_fffffffffffff6f8 >> 0x20));
          QList<QString>::operator=
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0)
                     ,(QList<QString> *)
                      CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
          QList<QString>::~QList((QList<QString> *)0x7298fc);
        }
        local_518.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_518 = QList<QString>::begin
                              ((QList<QString> *)
                               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
        local_520.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        local_520 = QList<QString>::end((QList<QString> *)
                                        CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0
                                                ));
        while( true ) {
          local_528 = local_520.i;
          bVar1 = QList<QString>::const_iterator::operator!=(&local_518,local_520);
          if (!bVar1) break;
          QList<QString>::const_iterator::operator*(&local_518);
          local_538.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_538.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QStringView::QStringView(&local_538);
          local_548.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_548.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QStringView::QStringView(&local_548);
          local_558.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_558.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QStringView::QStringView(&local_558);
          QStringView::QStringView<QString,_true>
                    (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
          name.m_data = (storage_type_conflict *)in_stack_fffffffffffff788.jd;
          name.m_size = in_stack_fffffffffffff780;
          bVar1 = qt_splitLocaleName(name,in_stack_fffffffffffff710,in_stack_fffffffffffff708,
                                     in_stack_fffffffffffff700);
          if (bVar1) {
            bVar1 = QStringView::isEmpty((QStringView *)0x729ad7);
            if (bVar1) {
              Qt::Literals::StringLiterals::operator____s
                        ((char16_t *)in_stack_fffffffffffff708,(size_t)in_stack_fffffffffffff700);
            }
            else {
              QStringView::toString
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
            }
            bVar1 = QStringView::isEmpty((QStringView *)0x729b1e);
            if (!bVar1) {
              ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                          (QStringView *)
                          CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              ::operator+=(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
            }
            bVar1 = QStringView::isEmpty((QStringView *)0x729bbb);
            if (!bVar1) {
              ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                          (QStringView *)
                          CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
              ::operator+=(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
            }
            QList<QString>::append
                      ((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                       (parameter_type)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)
                      );
            QString::~QString((QString *)0x729c45);
          }
          QList<QString>::const_iterator::operator++(&local_518);
        }
        bVar1 = QList<QString>::isEmpty((QList<QString> *)0x729c6c);
        if (bVar1) {
          ::QVariant::QVariant((QVariant *)0x729c7f);
        }
        else {
          ::QVariant::QVariant
                    ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                     (QStringList *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
        }
        QList<QString>::~QList((QList<QString> *)0x729cb2);
        QString::~QString((QString *)0x729cbf);
      }
      else {
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (QStringList *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      }
      break;
    case 0x23:
      qvariant_cast<QStringView>((QVariant *)in_stack_fffffffffffff700);
      str.m_size._4_4_ = in_stack_fffffffffffff7f4;
      str.m_size._0_4_ = in_stack_fffffffffffff7f0;
      str.m_data = in_stack_fffffffffffff7f8;
      QLocale::quoteString
                (in_stack_fffffffffffff750,str,
                 CONCAT22(in_stack_fffffffffffff74e,in_stack_fffffffffffff74c));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x729d6c);
      break;
    case 0x24:
      qvariant_cast<QStringView>((QVariant *)&pTVar3->lc_messages);
      str_00.m_size._4_4_ = in_stack_fffffffffffff7f4;
      str_00.m_size._0_4_ = in_stack_fffffffffffff7f0;
      str_00.m_data = in_stack_fffffffffffff7f8;
      QLocale::quoteString
                (in_stack_fffffffffffff750,str_00,
                 CONCAT22(in_stack_fffffffffffff74e,in_stack_fffffffffffff74c));
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x729e08);
      break;
    case 0x26:
      ::QVariant::toStringList
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::createSeparatedList
                (in_stack_fffffffffffff790,(QStringList *)in_stack_fffffffffffff788.jd);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x729e7a);
      QList<QString>::~QList((QList<QString> *)0x729e87);
      break;
    case 0x27:
    default:
      ::QVariant::QVariant((QVariant *)0x729ecc);
      break;
    case 0x2a:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::standaloneMonthName
                ((QLocale *)in_stack_fffffffffffff708,
                 (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728989);
      break;
    case 0x2b:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::standaloneMonthName
                ((QLocale *)in_stack_fffffffffffff708,
                 (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728a08);
      break;
    case 0x2c:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::standaloneMonthName
                ((QLocale *)in_stack_fffffffffffff708,
                 (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728a87);
      break;
    case 0x2d:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::standaloneDayName
                ((QLocale *)in_stack_fffffffffffff708,
                 (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728695);
      break;
    case 0x2e:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::standaloneDayName
                ((QLocale *)in_stack_fffffffffffff708,
                 (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728714);
      break;
    case 0x2f:
      ::QVariant::toInt((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                        (bool *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QLocale::standaloneDayName
                ((QLocale *)in_stack_fffffffffffff708,
                 (int)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (FormatType)in_stack_fffffffffffff700);
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                 (QString *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      QString::~QString((QString *)0x728793);
    }
    QReadLocker::~QReadLocker((QReadLocker *)0x729ee4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSystemLocale::query(QueryType type, QVariant &&in) const
{
    QSystemLocaleData *d = qSystemLocaleData();
    if (!d)
        return QVariant();

    if (type == LocaleChanged) {
        d->readEnvironment();
        return QVariant();
    }

    QReadLocker locker(&d->lock);

    const QLocale &lc_numeric = d->lc_numeric;
    const QLocale &lc_time = d->lc_time;
    const QLocale &lc_monetary = d->lc_monetary;
    const QLocale &lc_messages = d->lc_messages;

    switch (type) {
    case DecimalPoint:
        return lc_numeric.decimalPoint();
    case Grouping:
        return QVariant::fromValue(lc_numeric.d->m_data->groupSizes());
    case GroupSeparator:
        return lc_numeric.groupSeparator();
    case ZeroDigit:
        return lc_numeric.zeroDigit();
    case NegativeSign:
        return lc_numeric.negativeSign();
    case DateFormatLong:
        return lc_time.dateFormat(QLocale::LongFormat);
    case DateFormatShort:
        return lc_time.dateFormat(QLocale::ShortFormat);
    case TimeFormatLong:
        return lc_time.timeFormat(QLocale::LongFormat);
    case TimeFormatShort:
        return lc_time.timeFormat(QLocale::ShortFormat);
    case DayNameLong:
        return lc_time.dayName(in.toInt(), QLocale::LongFormat);
    case DayNameShort:
        return lc_time.dayName(in.toInt(), QLocale::ShortFormat);
    case DayNameNarrow:
        return lc_time.dayName(in.toInt(), QLocale::NarrowFormat);
    case StandaloneDayNameLong:
        return lc_time.standaloneDayName(in.toInt(), QLocale::LongFormat);
    case StandaloneDayNameShort:
        return lc_time.standaloneDayName(in.toInt(), QLocale::ShortFormat);
    case StandaloneDayNameNarrow:
        return lc_time.standaloneDayName(in.toInt(), QLocale::NarrowFormat);
    case MonthNameLong:
        return lc_time.monthName(in.toInt(), QLocale::LongFormat);
    case MonthNameShort:
        return lc_time.monthName(in.toInt(), QLocale::ShortFormat);
    case MonthNameNarrow:
        return lc_time.monthName(in.toInt(), QLocale::NarrowFormat);
    case StandaloneMonthNameLong:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::LongFormat);
    case StandaloneMonthNameShort:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::ShortFormat);
    case StandaloneMonthNameNarrow:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::NarrowFormat);
    case DateToStringLong:
        return lc_time.toString(in.toDate(), QLocale::LongFormat);
    case DateToStringShort:
        return lc_time.toString(in.toDate(), QLocale::ShortFormat);
    case TimeToStringLong:
        return lc_time.toString(in.toTime(), QLocale::LongFormat);
    case TimeToStringShort:
        return lc_time.toString(in.toTime(), QLocale::ShortFormat);
    case DateTimeFormatLong:
        return lc_time.dateTimeFormat(QLocale::LongFormat);
    case DateTimeFormatShort:
        return lc_time.dateTimeFormat(QLocale::ShortFormat);
    case DateTimeToStringLong:
        return lc_time.toString(in.toDateTime(), QLocale::LongFormat);
    case DateTimeToStringShort:
        return lc_time.toString(in.toDateTime(), QLocale::ShortFormat);
    case PositiveSign:
        return lc_numeric.positiveSign();
    case AMText:
        return lc_time.amText();
    case PMText:
        return lc_time.pmText();
    case FirstDayOfWeek:
        return lc_time.firstDayOfWeek();
    case CurrencySymbol:
        return lc_monetary.currencySymbol(QLocale::CurrencySymbolFormat(in.toUInt()));
    case CurrencyToString: {
        switch (in.userType()) {
        case QMetaType::Int:
            return lc_monetary.toCurrencyString(in.toInt());
        case QMetaType::UInt:
            return lc_monetary.toCurrencyString(in.toUInt());
        case QMetaType::Double:
            return lc_monetary.toCurrencyString(in.toDouble());
        case QMetaType::LongLong:
            return lc_monetary.toCurrencyString(in.toLongLong());
        case QMetaType::ULongLong:
            return lc_monetary.toCurrencyString(in.toULongLong());
        default:
            break;
        }
        return QString();
    }
    case MeasurementSystem: {
        const QString meas_locale = QString::fromLatin1(d->lc_measurement_var);
        if (meas_locale.compare("Metric"_L1, Qt::CaseInsensitive) == 0)
            return QLocale::MetricSystem;
        if (meas_locale.compare("Other"_L1, Qt::CaseInsensitive) == 0)
            return QLocale::MetricSystem;
        return QVariant((int)QLocale(meas_locale).measurementSystem());
    }
    case Collation:
        return QString::fromLatin1(d->lc_collate_var);
    case UILanguages: {
        if (!d->uiLanguages.isEmpty())
            return d->uiLanguages;
        QString languages = QString::fromLatin1(qgetenv("LANGUAGE"));
        QStringList lst;
        if (languages.isEmpty())
            lst.append(QString::fromLatin1(d->lc_messages_var));
        else
            lst = languages.split(u':');

        for (const QString &e : std::as_const(lst)) {
            QStringView language, script, territory;
            if (qt_splitLocaleName(e, &language, &script, &territory)) {
                QString joined = language.isEmpty() ? u"und"_s : language.toString();
                if (!script.isEmpty())
                    joined += u'-' + script;
                if (!territory.isEmpty())
                    joined += u'-' + territory;
                d->uiLanguages.append(joined);
            }
        }
        return d->uiLanguages.isEmpty() ? QVariant() : QVariant(d->uiLanguages);
    }
    case StringToStandardQuotation:
        return lc_messages.quoteString(qvariant_cast<QStringView>(std::move(in)));
    case StringToAlternateQuotation:
        return lc_messages.quoteString(qvariant_cast<QStringView>(std::move(in)),
                                       QLocale::AlternateQuotation);
    case ListToSeparatedString:
        return lc_messages.createSeparatedList(in.toStringList());
    case LocaleChanged:
        Q_ASSERT(false);
        [[fallthrough]];
    default:
        break;
    }
    return QVariant();
}